

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

url_mapper * __thiscall cppcms::url_mapper::topmost(url_mapper *this)

{
  data *pdVar1;
  url_mapper *puVar2;
  url_mapper *in_RDI;
  application *app;
  url_mapper *local_8;
  
  pdVar1 = booster::hold_ptr<cppcms::url_mapper::data>::operator->(&in_RDI->d);
  local_8 = in_RDI;
  if (pdVar1->this_application != (application *)0x0) {
    while( true ) {
      puVar2 = application::mapper((application *)0x3bc191);
      pdVar1 = booster::hold_ptr<cppcms::url_mapper::data>::operator->(&puVar2->d);
      if (pdVar1->parent == (application *)0x0) break;
      puVar2 = application::mapper((application *)0x3bc1aa);
      booster::hold_ptr<cppcms::url_mapper::data>::operator->(&puVar2->d);
    }
    local_8 = application::mapper((application *)0x3bc1c7);
  }
  return local_8;
}

Assistant:

url_mapper &url_mapper::topmost()
	{
		application *app = d->this_application;
		if(!app)
			return *this;
		while(app->mapper().d->parent)
			app = app->mapper().d->parent;
		return app->mapper();
	}